

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_validate(REF_CAVITY ref_cavity)

{
  int iVar1;
  uint uVar2;
  REF_NODE pRVar3;
  int local_34;
  int local_30;
  REF_INT seg_node;
  REF_INT seg;
  REF_INT face_node;
  REF_INT face;
  REF_INT node;
  REF_NODE ref_node;
  REF_CAVITY ref_cavity_local;
  
  pRVar3 = ref_cavity->ref_grid->node;
  if (((ref_cavity->node < 0) || (pRVar3->max <= ref_cavity->node)) ||
     (pRVar3->global[ref_cavity->node] < 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x8f1,
           "ref_cavity_validate","cavity node not valid");
    ref_cavity_local._4_4_ = 1;
  }
  else if ((ref_cavity->surf_node == -1) ||
          (((-1 < ref_cavity->surf_node && (ref_cavity->surf_node < pRVar3->max)) &&
           (-1 < pRVar3->global[ref_cavity->surf_node])))) {
    for (seg = 0; seg < ref_cavity->maxface; seg = seg + 1) {
      if (((-1 < seg) && (seg < ref_cavity->maxface)) && (ref_cavity->f2n[seg * 3] != -1)) {
        for (seg_node = 0; seg_node < 3; seg_node = seg_node + 1) {
          iVar1 = ref_cavity->f2n[seg_node + seg * 3];
          if (((iVar1 < 0) || (pRVar3->max <= iVar1)) || (pRVar3->global[iVar1] < 0)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x8fa,"ref_cavity_validate","cavity face node not valid");
            return 1;
          }
        }
      }
    }
    for (local_30 = 0; local_30 < ref_cavity->maxseg; local_30 = local_30 + 1) {
      if (((-1 < local_30) && (local_30 < ref_cavity->maxseg)) &&
         (ref_cavity->s2n[local_30 * 3] != -1)) {
        for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
          uVar2 = ref_cavity->s2n[local_34 + local_30 * 3];
          if ((((int)uVar2 < 0) || (pRVar3->max <= (int)uVar2)) || (pRVar3->global[(int)uVar2] < 0))
          {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x903,"ref_cavity_validate","cavity segment node not valid");
            printf("for node %d\n",(ulong)uVar2);
            return 1;
          }
        }
      }
    }
    ref_cavity_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x8f4,
           "ref_cavity_validate","cavity surf node not valid");
    ref_cavity_local._4_4_ = 1;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_validate(REF_CAVITY ref_cavity) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT node;
  REF_INT face, face_node;
  REF_INT seg, seg_node;

  RAS(ref_node_valid(ref_node, ref_cavity_node(ref_cavity)),
      "cavity node not valid");
  if (REF_EMPTY != ref_cavity_surf_node(ref_cavity))
    RAS(ref_node_valid(ref_node, ref_cavity_surf_node(ref_cavity)),
        "cavity surf node not valid");

  each_ref_cavity_valid_face(ref_cavity, face) {
    ; /* semi to force format */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      node = ref_cavity_f2n(ref_cavity, face_node, face);
      RAS(ref_node_valid(ref_node, node), "cavity face node not valid");
    }
  }